

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O0

int64_t Allocations::getSubAreaUsage(int64_t fileID,int64_t position)

{
  long lVar1;
  _Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_> _Var2;
  _Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_> _Var3;
  bool bVar4;
  pointer ppVar5;
  long *plVar6;
  mapped_type *pmVar7;
  long local_58;
  int64_t extent;
  _Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_> it;
  pair<std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>,_std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>_>
  range;
  int64_t maxExtent;
  Key key;
  int64_t position_local;
  int64_t fileID_local;
  
  range.second._M_node = (_Base_ptr)0x0;
  maxExtent = fileID;
  key.fileID = position;
  key.position = position;
  _it = std::
        multimap<Allocations::Key,_Allocations::SubArea,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>_>
        ::equal_range(&subAreas,(key_type *)&maxExtent);
  extent = (int64_t)it._M_node;
  while( true ) {
    bVar4 = std::operator!=((_Self *)&extent,&range.first);
    _Var2 = range.second;
    if (!bVar4) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>
                         *)&extent);
    lVar1 = (ppVar5->second).offset;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>
                         *)&extent);
    local_58 = lVar1 + (ppVar5->second).size;
    plVar6 = std::max<long>(&local_58,(long *)&range.second);
    range.second._M_node = (_Base_ptr)*plVar6;
    std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_> *)
               &extent);
  }
  pmVar7 = std::
           map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
           ::operator[](&allocations,(key_type *)&maxExtent);
  _Var3 = range.second;
  if (pmVar7->usage < (long)_Var2._M_node) {
    pmVar7 = std::
             map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
             ::operator[](&allocations,(key_type *)&maxExtent);
    fileID_local = (long)_Var3._M_node - pmVar7->usage;
  }
  else {
    fileID_local = 0;
  }
  return fileID_local;
}

Assistant:

int64_t Allocations::getSubAreaUsage(int64_t fileID, int64_t position)
{
	Key key{ fileID, position };
	// For safety, just find the end of the last sub area.
	int64_t maxExtent = 0;
	auto range = subAreas.equal_range(key);
	for (auto it = range.first; it != range.second; ++it)
	{
		int64_t extent = it->second.offset + it->second.size;
		maxExtent = std::max(extent, maxExtent);
	}

	// Now subtract out the original usage.
	if (maxExtent <= allocations[key].usage)
		return 0;
	return maxExtent - allocations[key].usage;
}